

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O1

string * __thiscall
MADPComponentDiscreteObservations::SoftPrintObservationSets_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteObservations *this)

{
  pointer pvVar1;
  pointer pOVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  ulong uVar5;
  pointer pOVar6;
  stringstream ss_1;
  stringstream ss;
  long *local_340;
  long local_338;
  long local_330 [47];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->_m_initialized != false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Observations:",0xd);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    if ((this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar5 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"agentI ",7);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," - nrObservations ",0x12);
        GetNrObservations(this,(Index)uVar5);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        pvVar1 = (this->_m_observationVecs).
                 super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pOVar2 = *(pointer *)
                  ((long)&pvVar1[uVar5].
                          super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (pOVar6 = pvVar1[uVar5].
                      super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>.
                      _M_impl.super__Vector_impl_data._M_start; pOVar6 != pOVar2;
            pOVar6 = pOVar6 + 1) {
          (**(code **)((long)(pOVar6->super_Observation).super_NamedDescribedEntity.
                             _vptr_NamedDescribedEntity + 0x10))(&local_340,pOVar6);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_340,local_338);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          if (local_340 != local_330) {
            operator_delete(local_340,local_330[0] + 1);
          }
        }
        uVar5 = (ulong)((Index)uVar5 + 1);
      } while (uVar5 < (ulong)((long)(this->_m_nrObservations).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_m_nrObservations).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,"MADPComponentDiscreteObservations::PrintObservationSets(",0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,") - Error: not initialized. ",0x1c);
  std::endl<char,std::char_traits<char>>((ostream *)local_330);
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar4 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar4,&E::typeinfo,E::~E);
}

Assistant:

string MADPComponentDiscreteObservations::SoftPrintObservationSets() const
{    
    stringstream ss;
    if(!_m_initialized)
    {
    stringstream ss;
        ss << "MADPComponentDiscreteObservations::PrintObservationSets("<< 
        ") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    ss << "Observations:"<<endl;
    for(Index agentIndex=0; agentIndex < _m_nrObservations.size(); agentIndex++)
    {
    ss << "agentI " << agentIndex << " - nrObservations " << 
        GetNrObservations(agentIndex)<<endl;
    vector<ObservationDiscrete>::const_iterator f =
        _m_observationVecs[agentIndex].begin();
    vector<ObservationDiscrete>::const_iterator l =
        _m_observationVecs[agentIndex].end();
    while(f != l)
    {
        ss << (*f).SoftPrint() << endl;
//        GetName() << " - " << (*f).GetDescription()<<endl;
        f++;
    }
    }
    return(ss.str());
}